

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Polygon.cpp
# Opt level: O0

void __thiscall
vectorgraphics::Polygon3D::Polygon3D
          (Polygon3D *this,vector<double,_std::allocator<double>_> *coordinates)

{
  ulong uVar1;
  size_type sVar2;
  reference __args_1;
  reference __args_2;
  size_type sVar3;
  reference pvVar4;
  value_type local_60;
  value_type local_50 [2];
  value_type local_30;
  size_type local_20;
  size_t index;
  vector<double,_std::allocator<double>_> *coordinates_local;
  Polygon3D *this_local;
  
  index = (size_t)coordinates;
  coordinates_local = (vector<double,_std::allocator<double>_> *)this;
  Primitive::Primitive(&this->super_Primitive);
  std::
  vector<std::shared_ptr<vectorgraphics::LineSegment3D>,_std::allocator<std::shared_ptr<vectorgraphics::LineSegment3D>_>_>
  ::vector(&this->line_segment_ptrs_);
  std::
  vector<std::shared_ptr<vectorgraphics::Point3D>,_std::allocator<std::shared_ptr<vectorgraphics::Point3D>_>_>
  ::vector(&this->point_ptrs_);
  local_20 = 0;
  while( true ) {
    uVar1 = local_20 + 2;
    sVar2 = std::vector<double,_std::allocator<double>_>::size(coordinates);
    if (sVar2 <= uVar1) break;
    __args_1 = std::vector<double,_std::allocator<double>_>::operator[](coordinates,local_20);
    __args_2 = std::vector<double,_std::allocator<double>_>::operator[](coordinates,local_20 + 1);
    std::vector<double,_std::allocator<double>_>::operator[](coordinates,local_20 + 2);
    std::make_shared<vectorgraphics::Point3D,double&,double&,double&>
              ((double *)&local_30,__args_1,__args_2);
    std::
    vector<std::shared_ptr<vectorgraphics::Point3D>,_std::allocator<std::shared_ptr<vectorgraphics::Point3D>_>_>
    ::push_back(&this->point_ptrs_,&local_30);
    std::shared_ptr<vectorgraphics::Point3D>::~shared_ptr(&local_30);
    local_20 = local_20 + 3;
  }
  local_20 = 1;
  while( true ) {
    sVar2 = local_20;
    sVar3 = std::
            vector<std::shared_ptr<vectorgraphics::Point3D>,_std::allocator<std::shared_ptr<vectorgraphics::Point3D>_>_>
            ::size(&this->point_ptrs_);
    if (sVar3 <= sVar2) break;
    pvVar4 = std::
             vector<std::shared_ptr<vectorgraphics::Point3D>,_std::allocator<std::shared_ptr<vectorgraphics::Point3D>_>_>
             ::operator[](&this->point_ptrs_,local_20 - 1);
    std::
    vector<std::shared_ptr<vectorgraphics::Point3D>,_std::allocator<std::shared_ptr<vectorgraphics::Point3D>_>_>
    ::operator[](&this->point_ptrs_,local_20);
    std::
    make_shared<vectorgraphics::LineSegment3D,std::shared_ptr<vectorgraphics::Point3D>&,std::shared_ptr<vectorgraphics::Point3D>&>
              ((shared_ptr<vectorgraphics::Point3D> *)local_50,pvVar4);
    std::
    vector<std::shared_ptr<vectorgraphics::LineSegment3D>,_std::allocator<std::shared_ptr<vectorgraphics::LineSegment3D>_>_>
    ::push_back(&this->line_segment_ptrs_,local_50);
    std::shared_ptr<vectorgraphics::LineSegment3D>::~shared_ptr(local_50);
    local_20 = local_20 + 1;
  }
  pvVar4 = std::
           vector<std::shared_ptr<vectorgraphics::Point3D>,_std::allocator<std::shared_ptr<vectorgraphics::Point3D>_>_>
           ::operator[](&this->point_ptrs_,local_20 - 1);
  std::
  vector<std::shared_ptr<vectorgraphics::Point3D>,_std::allocator<std::shared_ptr<vectorgraphics::Point3D>_>_>
  ::operator[](&this->point_ptrs_,0);
  std::
  make_shared<vectorgraphics::LineSegment3D,std::shared_ptr<vectorgraphics::Point3D>&,std::shared_ptr<vectorgraphics::Point3D>&>
            ((shared_ptr<vectorgraphics::Point3D> *)&local_60,pvVar4);
  std::
  vector<std::shared_ptr<vectorgraphics::LineSegment3D>,_std::allocator<std::shared_ptr<vectorgraphics::LineSegment3D>_>_>
  ::push_back(&this->line_segment_ptrs_,&local_60);
  std::shared_ptr<vectorgraphics::LineSegment3D>::~shared_ptr(&local_60);
  return;
}

Assistant:

Polygon3D::Polygon3D(std::vector<double> coordinates) {
    size_t index=0;
    while(index+2 < coordinates.size()) {
      point_ptrs_.push_back(std::make_shared<Point3D>(coordinates[index], coordinates[index+1], coordinates[index+2]));
      index += 3;
    }

    index = 1;
    while(index < point_ptrs_.size()) {
      line_segment_ptrs_.push_back(std::make_shared<LineSegment3D>(point_ptrs_[index-1], point_ptrs_[index]));
      index += 1;
    }
    line_segment_ptrs_.push_back(std::make_shared<LineSegment3D>(point_ptrs_[index-1], point_ptrs_[0]));
  }